

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  Allocator *pAVar7;
  int k;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  void *pvVar23;
  uint uVar24;
  void *pvVar25;
  void *pvVar26;
  long lVar27;
  uint _w;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined4 *puVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  void *pvVar42;
  int iVar43;
  int iVar44;
  ulong uVar45;
  void *pvVar46;
  undefined4 *puVar47;
  void *pvVar48;
  long lVar49;
  ulong uVar50;
  void *pvVar51;
  long lVar52;
  long lVar53;
  undefined4 *puVar54;
  int iVar55;
  void *pvVar56;
  long lVar57;
  int iVar58;
  long lVar59;
  void *pvVar60;
  long lVar61;
  undefined4 *local_188;
  void *local_180;
  void *local_170;
  void *local_168;
  void *local_158;
  void *local_150;
  void *local_140;
  long local_120;
  int local_118;
  int local_114;
  long local_110;
  long local_108;
  int local_e0;
  int local_d8;
  int local_d0;
  
  if ((this->super_Convolution1D).dynamic_weight != 0) {
    return 0;
  }
  uVar1 = (this->super_Convolution1D).kernel_w;
  lVar33 = (long)(int)uVar1;
  uVar50 = (ulong)uVar1;
  uVar45 = (long)(this->super_Convolution1D).weight_data_size / (long)(int)uVar1;
  uVar24 = (this->super_Convolution1D).num_output;
  uVar22 = (ulong)(int)uVar24;
  uVar45 = (long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
           (long)(int)uVar24;
  uVar37 = (uint)uVar45;
  uVar17 = uVar37;
  if ((long)uVar22 < 8) {
    if ((int)uVar24 < 4) {
      if ((int)uVar24 < 2) {
        uVar13 = uVar24;
        if ((int)uVar37 < 8) {
          if ((int)uVar37 < 4) {
            _w = uVar1;
            if (1 < (int)uVar37) {
              _w = uVar1 * 2;
              uVar17 = (uVar37 & 1) + 1;
            }
          }
          else {
            _w = uVar1 * 4;
            uVar17 = (uVar37 & 1) + 1 + (uint)((uVar37 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar1 * 8;
          uVar17 = (uVar37 & 1) + (uVar37 >> 3) + (uVar37 >> 2 & 1) + (uint)((uVar37 >> 1 & 1) != 0)
          ;
        }
      }
      else {
        if ((int)uVar37 < 8) {
          if ((int)uVar37 < 4) {
            if ((int)uVar37 < 2) {
              _w = uVar1 * 2;
            }
            else {
              _w = uVar1 * 4;
              uVar17 = (uVar37 & 1) + 1;
            }
            uVar13 = (uVar24 & 1) + 1;
            goto LAB_00598186;
          }
          uVar17 = (uVar37 & 1) + 1 + (uint)((uVar37 >> 1 & 1) != 0);
          _w = uVar1 * 8;
        }
        else {
          _w = uVar1 << 4;
          uVar17 = (uVar37 & 1) + (uVar37 >> 3) + (uVar37 >> 2 & 1) + (uint)((uVar37 >> 1 & 1) != 0)
          ;
        }
        uVar13 = (uVar24 & 1) + 1;
      }
    }
    else {
      if ((int)uVar37 < 8) {
        if ((int)uVar37 < 4) {
          if ((int)uVar37 < 2) {
            _w = uVar1 * 4;
          }
          else {
            _w = uVar1 * 8;
            uVar17 = (uVar37 & 1) + 1;
          }
          uVar13 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
          goto LAB_00598186;
        }
        _w = uVar1 << 4;
        uVar17 = (uVar37 & 1) + 1 + (uint)((uVar37 >> 1 & 1) != 0);
      }
      else {
        _w = uVar1 << 5;
        uVar17 = (uVar37 & 1) + (uVar37 >> 3) + (uVar37 >> 2 & 1) + (uint)((uVar37 >> 1 & 1) != 0);
      }
      uVar13 = (uVar24 & 1) + 1 + (uint)((uVar24 >> 1 & 1) != 0);
    }
  }
  else {
    if ((int)uVar37 < 8) {
      if ((int)uVar37 < 4) {
        if ((int)uVar37 < 2) {
          _w = uVar1 * 8;
          uVar13 = (uVar24 & 1) + (uVar24 >> 3) + (uVar24 >> 2 & 1) + (uint)((uVar24 >> 1 & 1) != 0)
          ;
        }
        else {
          _w = uVar1 << 4;
          uVar13 = (uVar24 & 1) + (uVar24 >> 3) + (uVar24 >> 2 & 1) + (uint)((uVar24 >> 1 & 1) != 0)
          ;
          uVar17 = (uVar37 & 1) + 1;
        }
        goto LAB_00598186;
      }
      _w = uVar1 << 5;
      uVar17 = (uVar37 & 1) + 1 + (uint)((uVar37 >> 1 & 1) != 0);
    }
    else {
      _w = uVar1 << 6;
      uVar17 = (uVar37 & 1) + ((uint)(uVar45 >> 3) & 0x1fffffff) + ((uint)(uVar45 >> 2) & 1) +
               (uint)((uVar37 >> 1 & 1) != 0);
    }
    uVar13 = (uVar24 & 1) + (uVar24 >> 3) + (uVar24 >> 2 & 1) + (uint)((uVar24 >> 1 & 1) != 0);
  }
LAB_00598186:
  Mat::create(&this->weight_data_tm,_w,uVar17,uVar13,4,(Allocator *)0x0);
  uVar45 = 0;
  if (7 < (int)uVar24) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    pvVar3 = (this->weight_data_tm).data;
    iVar18 = uVar37 * uVar1;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    lVar31 = (long)(int)(uVar1 * 8);
    lVar34 = (long)(int)(uVar1 * 4);
    lVar39 = (long)(int)(uVar1 * 2);
    iVar43 = uVar1 * uVar37;
    iVar19 = iVar43 * 8;
    iVar55 = iVar43 * 2;
    local_114 = iVar43 * 3;
    iVar43 = iVar43 * 4;
    local_d8 = uVar1 * uVar37;
    local_d0 = local_d8 * 5;
    local_118 = local_d8 * 7;
    local_d8 = local_d8 * 6;
    lVar30 = lVar33 * 4;
    iVar14 = 0;
    uVar12 = 0;
    local_e0 = iVar18;
    do {
      uVar17 = (uint)uVar12;
      local_188 = (undefined4 *)((uVar12 >> 3) * sVar4 * sVar5 + (long)pvVar3);
      pvVar8 = (void *)((long)(int)(iVar18 * uVar17) * 4 + (long)pvVar2);
      local_150 = (void *)((long)pvVar2 + (long)(int)((uVar17 | 1) * iVar18) * 4);
      local_180 = (void *)((long)pvVar2 + (long)(int)((uVar17 | 2) * iVar18) * 4);
      pvVar48 = (void *)((long)pvVar2 + (long)(int)((uVar17 | 3) * iVar18) * 4);
      local_158 = (void *)((long)pvVar2 + (long)(int)((uVar17 | 4) * iVar18) * 4);
      local_140 = (void *)((long)pvVar2 + (long)(int)((uVar17 | 5) * iVar18) * 4);
      local_170 = (void *)((long)(int)((uVar17 | 6) * iVar18) * 4 + (long)pvVar2);
      local_168 = (void *)((long)(int)((uVar17 | 7) * iVar18) * 4 + (long)pvVar2);
      if ((int)uVar37 < 8) {
        uVar17 = 0;
      }
      else {
        lVar40 = 0;
        iVar38 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar45 = 0;
            lVar35 = lVar40;
            do {
              puVar32 = local_188;
              lVar28 = 0;
              lVar59 = lVar35;
              do {
                *(undefined4 *)((long)puVar32 + lVar28) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)iVar14 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 4) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)local_e0 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 8) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)iVar55 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 0xc) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)local_114 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 0x10) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)iVar43 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 0x14) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)local_d0 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 0x18) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)local_d8 * 4);
                *(undefined4 *)((long)puVar32 + lVar28 + 0x1c) =
                     *(undefined4 *)((long)pvVar2 + lVar59 + (long)local_118 * 4);
                lVar28 = lVar28 + 0x20;
                lVar59 = lVar59 + lVar30;
              } while ((int)lVar28 != 0x100);
              uVar45 = uVar45 + 1;
              lVar35 = lVar35 + 4;
              local_188 = (undefined4 *)((long)puVar32 + lVar28);
            } while (uVar45 != uVar50);
            local_188 = (undefined4 *)((long)puVar32 + lVar28);
          }
          pvVar8 = (void *)((long)pvVar8 + lVar31 * 4);
          local_150 = (void *)((long)local_150 + lVar31 * 4);
          local_180 = (void *)((long)local_180 + lVar31 * 4);
          pvVar48 = (void *)((long)pvVar48 + lVar31 * 4);
          local_158 = (void *)((long)local_158 + lVar31 * 4);
          local_140 = (void *)((long)local_140 + lVar31 * 4);
          local_170 = (void *)((long)local_170 + lVar31 * 4);
          local_168 = (void *)((long)local_168 + lVar31 * 4);
          iVar44 = iVar38 + 0xf;
          lVar40 = lVar40 + lVar31 * 4;
          uVar17 = uVar37 & 0xfffffff8;
          iVar38 = iVar38 + 8;
        } while (iVar44 < (int)uVar37);
      }
      pvVar42 = pvVar8;
      pvVar23 = local_158;
      pvVar56 = local_170;
      pvVar15 = local_150;
      pvVar25 = local_168;
      pvVar26 = local_140;
      pvVar51 = pvVar48;
      pvVar9 = local_180;
      if ((int)(uVar17 | 3) < (int)uVar37) {
        local_120 = 0;
        uVar13 = uVar17;
        do {
          if (0 < (int)uVar1) {
            uVar45 = 0;
            lVar40 = local_120;
            do {
              puVar32 = local_188;
              lVar59 = 0;
              lVar35 = lVar40;
              do {
                *(undefined4 *)((long)puVar32 + lVar59) = *(undefined4 *)((long)pvVar8 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 4) =
                     *(undefined4 *)((long)local_150 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 8) =
                     *(undefined4 *)((long)local_180 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 0xc) =
                     *(undefined4 *)((long)pvVar48 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 0x10) =
                     *(undefined4 *)((long)local_158 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 0x14) =
                     *(undefined4 *)((long)local_140 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 0x18) =
                     *(undefined4 *)((long)local_170 + lVar35);
                *(undefined4 *)((long)puVar32 + lVar59 + 0x1c) =
                     *(undefined4 *)((long)local_168 + lVar35);
                lVar59 = lVar59 + 0x20;
                lVar35 = lVar35 + lVar30;
              } while ((int)lVar59 != 0x80);
              uVar45 = uVar45 + 1;
              lVar40 = lVar40 + 4;
              local_188 = (undefined4 *)((long)puVar32 + lVar59);
            } while (uVar45 != uVar50);
            local_188 = (undefined4 *)((long)puVar32 + lVar59);
          }
          pvVar42 = (void *)((long)pvVar42 + lVar34 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar34 * 4);
          pvVar9 = (void *)((long)pvVar9 + lVar34 * 4);
          pvVar51 = (void *)((long)pvVar51 + lVar34 * 4);
          pvVar23 = (void *)((long)pvVar23 + lVar34 * 4);
          pvVar26 = (void *)((long)pvVar26 + lVar34 * 4);
          pvVar56 = (void *)((long)pvVar56 + lVar34 * 4);
          pvVar25 = (void *)((long)pvVar25 + lVar34 * 4);
          uVar17 = uVar13 + 4;
          iVar38 = uVar13 + 7;
          local_120 = local_120 + lVar34 * 4;
          uVar13 = uVar17;
        } while (iVar38 < (int)uVar37);
      }
      pvVar8 = pvVar42;
      pvVar48 = pvVar9;
      pvVar60 = pvVar26;
      local_180 = pvVar51;
      local_168 = pvVar15;
      local_158 = pvVar56;
      local_150 = pvVar23;
      local_140 = pvVar25;
      if ((int)(uVar17 | 1) < (int)uVar37) {
        local_170 = (void *)0x0;
        uVar13 = uVar17;
        do {
          if (0 < (int)uVar1) {
            uVar45 = 0;
            pvVar46 = local_170;
            do {
              puVar32 = local_188;
              lVar35 = 0;
              lVar40 = (long)pvVar46;
              do {
                *(undefined4 *)((long)puVar32 + lVar35) = *(undefined4 *)((long)pvVar42 + lVar40);
                *(undefined4 *)((long)puVar32 + lVar35 + 4) =
                     *(undefined4 *)((long)pvVar15 + lVar40);
                *(undefined4 *)((long)puVar32 + lVar35 + 8) = *(undefined4 *)((long)pvVar9 + lVar40)
                ;
                *(undefined4 *)((long)puVar32 + lVar35 + 0xc) =
                     *(undefined4 *)((long)pvVar51 + lVar40);
                *(undefined4 *)((long)puVar32 + lVar35 + 0x10) =
                     *(undefined4 *)((long)pvVar23 + lVar40);
                *(undefined4 *)((long)puVar32 + lVar35 + 0x14) =
                     *(undefined4 *)((long)pvVar26 + lVar40);
                *(undefined4 *)((long)puVar32 + lVar35 + 0x18) =
                     *(undefined4 *)((long)pvVar56 + lVar40);
                *(undefined4 *)((long)puVar32 + lVar35 + 0x1c) =
                     *(undefined4 *)((long)pvVar25 + lVar40);
                lVar35 = lVar35 + 0x20;
                lVar40 = lVar40 + lVar30;
              } while ((int)lVar35 == 0x20);
              uVar45 = uVar45 + 1;
              pvVar46 = (void *)((long)pvVar46 + 4);
              local_188 = (undefined4 *)((long)puVar32 + lVar35);
            } while (uVar45 != uVar50);
            local_188 = (undefined4 *)((long)puVar32 + lVar35);
          }
          pvVar8 = (void *)((long)pvVar8 + lVar39 * 4);
          local_168 = (void *)((long)local_168 + lVar39 * 4);
          pvVar48 = (void *)((long)pvVar48 + lVar39 * 4);
          local_180 = (void *)((long)local_180 + lVar39 * 4);
          local_150 = (void *)((long)local_150 + lVar39 * 4);
          pvVar60 = (void *)((long)pvVar60 + lVar39 * 4);
          local_158 = (void *)((long)local_158 + lVar39 * 4);
          local_140 = (void *)((long)local_140 + lVar39 * 4);
          uVar17 = uVar13 + 2;
          iVar38 = uVar13 + 3;
          local_170 = (void *)((long)local_170 + lVar39 * 4);
          uVar13 = uVar17;
        } while (iVar38 < (int)uVar37);
      }
      if ((int)uVar17 < (int)uVar37) {
        do {
          if (0 < (int)uVar1) {
            lVar40 = 0;
            puVar32 = local_188;
            do {
              puVar54 = puVar32;
              puVar32 = local_188 + lVar40 * 2;
              *puVar32 = *(undefined4 *)((long)pvVar8 + lVar40);
              puVar32[1] = *(undefined4 *)((long)local_168 + lVar40);
              puVar32[2] = *(undefined4 *)((long)pvVar48 + lVar40);
              puVar32[3] = *(undefined4 *)((long)local_180 + lVar40);
              puVar32[4] = *(undefined4 *)((long)local_150 + lVar40);
              puVar32[5] = *(undefined4 *)((long)pvVar60 + lVar40);
              puVar32[6] = *(undefined4 *)((long)local_158 + lVar40);
              puVar32[7] = *(undefined4 *)((long)local_140 + lVar40);
              lVar40 = lVar40 + 4;
              puVar32 = puVar32 + 8;
            } while (uVar50 * 4 != lVar40);
            local_188 = puVar54 + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar37);
      }
      uVar45 = uVar12 + 8;
      uVar36 = uVar12 + 0xf;
      iVar14 = iVar14 + iVar19;
      local_e0 = local_e0 + iVar19;
      iVar55 = iVar55 + iVar19;
      local_114 = local_114 + iVar19;
      iVar43 = iVar43 + iVar19;
      local_d0 = local_d0 + iVar19;
      local_118 = local_118 + iVar19;
      local_d8 = local_d8 + iVar19;
      uVar12 = uVar45;
    } while (uVar36 < uVar22);
  }
  uVar17 = (uint)uVar45;
  uVar13 = uVar17 | 3;
  uVar12 = (ulong)uVar13;
  if ((int)uVar13 < (int)uVar24) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    pvVar3 = (this->weight_data_tm).data;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    iVar18 = uVar37 * uVar1;
    local_108._0_4_ = uVar37 & 0xfffffff8;
    iVar14 = uVar1 * uVar37;
    iVar19 = iVar14 * 4;
    iVar43 = (uVar17 + 2) * iVar14;
    iVar14 = iVar14 * uVar13;
    lVar31 = (long)(int)(uVar1 * 8) * 4;
    iVar38 = (uVar17 + 1) * uVar1 * uVar37;
    iVar55 = uVar1 * uVar37 * uVar17;
    lVar30 = lVar33 * 4;
    lVar34 = (long)(int)(uVar1 * 4) * 4;
    lVar39 = (long)(int)(uVar1 * 2) * 4;
    uVar36 = uVar45 & 0xffffffff;
    do {
      uVar17 = (uint)uVar36;
      puVar32 = (undefined4 *)
                ((ulong)(((uint)(uVar36 >> 3) & 0x1fffffff) + (uint)((uVar17 >> 2 & 1) != 0)) *
                 sVar4 * sVar5 + (long)pvVar3);
      if ((int)uVar37 < 8) {
        pvVar8 = (void *)((long)pvVar2 + (long)(int)(iVar18 * uVar17) * 4);
        pvVar48 = (void *)((long)pvVar2 + (long)(int)((uVar17 + 1) * iVar18) * 4);
        pvVar42 = (void *)((long)pvVar2 + (long)(int)((uVar17 + 2) * iVar18) * 4);
        pvVar15 = (void *)((long)pvVar2 + (long)((int)uVar12 * iVar18) * 4);
        uVar17 = 0;
      }
      else {
        pvVar15 = (void *)((long)pvVar2 + (long)iVar14 * 4);
        pvVar42 = (void *)((long)pvVar2 + (long)iVar43 * 4);
        pvVar48 = (void *)((long)pvVar2 + (long)iVar38 * 4);
        pvVar8 = (void *)((long)pvVar2 + (long)iVar55 * 4);
        iVar44 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar45 = 0;
            pvVar9 = pvVar48;
            pvVar23 = pvVar42;
            pvVar26 = pvVar8;
            pvVar56 = pvVar15;
            do {
              puVar54 = puVar32;
              lVar40 = 0;
              lVar35 = 0;
              do {
                *(undefined4 *)((long)puVar54 + lVar35) = *(undefined4 *)((long)pvVar26 + lVar40);
                *(undefined4 *)((long)puVar54 + lVar35 + 4) = *(undefined4 *)((long)pvVar9 + lVar40)
                ;
                *(undefined4 *)((long)puVar54 + lVar35 + 8) =
                     *(undefined4 *)((long)pvVar23 + lVar40);
                *(undefined4 *)((long)puVar54 + lVar35 + 0xc) =
                     *(undefined4 *)((long)pvVar56 + lVar40);
                lVar35 = lVar35 + 0x10;
                lVar40 = lVar40 + lVar30;
              } while ((int)lVar35 != 0x80);
              uVar45 = uVar45 + 1;
              pvVar56 = (void *)((long)pvVar56 + 4);
              pvVar23 = (void *)((long)pvVar23 + 4);
              pvVar9 = (void *)((long)pvVar9 + 4);
              pvVar26 = (void *)((long)pvVar26 + 4);
              puVar32 = (undefined4 *)(lVar35 + (long)puVar54);
            } while (uVar45 != uVar50);
            puVar32 = (undefined4 *)((long)puVar54 + lVar35);
          }
          pvVar8 = (void *)((long)pvVar8 + lVar31);
          pvVar48 = (void *)((long)pvVar48 + lVar31);
          pvVar42 = (void *)((long)pvVar42 + lVar31);
          pvVar15 = (void *)((long)pvVar15 + lVar31);
          iVar58 = iVar44 + 0xf;
          uVar17 = (uint)local_108;
          iVar44 = iVar44 + 8;
        } while (iVar58 < (int)uVar37);
      }
      uVar13 = uVar17 | 3;
      while ((int)uVar13 < (int)uVar37) {
        if (0 < (int)uVar1) {
          uVar45 = 0;
          pvVar9 = pvVar48;
          pvVar23 = pvVar42;
          pvVar26 = pvVar15;
          pvVar56 = pvVar8;
          do {
            puVar54 = puVar32;
            lVar40 = 0;
            lVar35 = 0;
            do {
              *(undefined4 *)((long)puVar54 + lVar35) = *(undefined4 *)((long)pvVar56 + lVar40);
              *(undefined4 *)((long)puVar54 + lVar35 + 4) = *(undefined4 *)((long)pvVar9 + lVar40);
              *(undefined4 *)((long)puVar54 + lVar35 + 8) = *(undefined4 *)((long)pvVar23 + lVar40);
              *(undefined4 *)((long)puVar54 + lVar35 + 0xc) =
                   *(undefined4 *)((long)pvVar26 + lVar40);
              lVar35 = lVar35 + 0x10;
              lVar40 = lVar40 + lVar30;
            } while ((int)lVar35 != 0x40);
            uVar45 = uVar45 + 1;
            pvVar26 = (void *)((long)pvVar26 + 4);
            pvVar23 = (void *)((long)pvVar23 + 4);
            pvVar9 = (void *)((long)pvVar9 + 4);
            pvVar56 = (void *)((long)pvVar56 + 4);
            puVar32 = (undefined4 *)(lVar35 + (long)puVar54);
          } while (uVar45 != uVar50);
          puVar32 = (undefined4 *)((long)puVar54 + lVar35);
        }
        pvVar8 = (void *)((long)pvVar8 + lVar34);
        pvVar48 = (void *)((long)pvVar48 + lVar34);
        pvVar42 = (void *)((long)pvVar42 + lVar34);
        pvVar15 = (void *)((long)pvVar15 + lVar34);
        uVar13 = uVar17 + 7;
        uVar17 = uVar17 + 4;
      }
      uVar13 = uVar17 | 1;
      while ((int)uVar13 < (int)uVar37) {
        if (0 < (int)uVar1) {
          uVar45 = 0;
          pvVar9 = pvVar48;
          pvVar23 = pvVar42;
          pvVar26 = pvVar15;
          pvVar56 = pvVar8;
          do {
            puVar54 = puVar32;
            lVar40 = 0;
            lVar35 = 0;
            do {
              *(undefined4 *)((long)puVar54 + lVar35) = *(undefined4 *)((long)pvVar56 + lVar40);
              *(undefined4 *)((long)puVar54 + lVar35 + 4) = *(undefined4 *)((long)pvVar9 + lVar40);
              *(undefined4 *)((long)puVar54 + lVar35 + 8) = *(undefined4 *)((long)pvVar23 + lVar40);
              *(undefined4 *)((long)puVar54 + lVar35 + 0xc) =
                   *(undefined4 *)((long)pvVar26 + lVar40);
              lVar35 = lVar35 + 0x10;
              lVar40 = lVar40 + lVar30;
            } while ((int)lVar35 == 0x10);
            uVar45 = uVar45 + 1;
            pvVar26 = (void *)((long)pvVar26 + 4);
            pvVar23 = (void *)((long)pvVar23 + 4);
            pvVar9 = (void *)((long)pvVar9 + 4);
            pvVar56 = (void *)((long)pvVar56 + 4);
            puVar32 = (undefined4 *)(lVar35 + (long)puVar54);
          } while (uVar45 != uVar50);
          puVar32 = (undefined4 *)((long)puVar54 + lVar35);
        }
        pvVar8 = (void *)((long)pvVar8 + lVar39);
        pvVar48 = (void *)((long)pvVar48 + lVar39);
        pvVar42 = (void *)((long)pvVar42 + lVar39);
        pvVar15 = (void *)((long)pvVar15 + lVar39);
        uVar13 = uVar17 + 3;
        uVar17 = uVar17 + 2;
      }
      if ((int)uVar17 < (int)uVar37) {
        do {
          if (0 < (int)uVar1) {
            uVar45 = 0;
            do {
              *puVar32 = *(undefined4 *)((long)pvVar8 + uVar45 * 4);
              puVar32[1] = *(undefined4 *)((long)pvVar48 + uVar45 * 4);
              puVar32[2] = *(undefined4 *)((long)pvVar42 + uVar45 * 4);
              puVar32[3] = *(undefined4 *)((long)pvVar15 + uVar45 * 4);
              puVar32 = puVar32 + 4;
              uVar45 = uVar45 + 1;
            } while (uVar50 != uVar45);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar37);
      }
      uVar45 = uVar36 + 4;
      uVar10 = uVar36 + 7;
      uVar12 = uVar10 & 0xffffffff;
      iVar14 = iVar14 + iVar19;
      iVar43 = iVar43 + iVar19;
      iVar38 = iVar38 + iVar19;
      iVar55 = iVar55 + iVar19;
      uVar36 = uVar45;
    } while ((long)uVar10 < (long)uVar22);
  }
  uVar17 = (uint)uVar45 | 1;
  if ((int)uVar17 < (int)uVar24) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    lVar39 = (long)(int)(uVar1 * 2);
    lVar34 = (long)(int)(uVar1 * 3);
    lVar35 = (long)(int)(uVar1 * 4);
    iVar14 = uVar1 * uVar37 * (uint)uVar45;
    iVar19 = uVar1 * uVar37 * uVar17;
    iVar55 = uVar1 * uVar37 * 2;
    lVar31 = (long)(int)(uVar1 * 8) * 4;
    lVar59 = lVar35 * 4;
    lVar40 = lVar39 * 4;
    pvVar3 = (this->weight_data_tm).data;
    lVar30 = lVar33 * 4;
    uVar12 = uVar45 & 0xffffffff;
    do {
      puVar32 = (undefined4 *)
                ((ulong)(((uint)(uVar12 >> 2) & 1) + ((uint)(uVar12 >> 3) & 0x1fffffff) +
                        (uint)(((uint)uVar12 >> 1 & 1) != 0)) * sVar4 * sVar5 + (long)pvVar3);
      if ((int)uVar37 < 8) {
        local_168 = (void *)((long)pvVar2 + (long)(int)(uVar37 * uVar1 * (uint)uVar12) * 4);
        local_170 = (void *)((long)pvVar2 + (long)(int)(uVar17 * uVar37 * uVar1) * 4);
        uVar17 = 0;
      }
      else {
        lVar16 = (long)iVar19;
        lVar28 = (long)pvVar2 + lVar16 * 4 + (long)(int)(uVar1 * 7) * 4;
        lVar61 = (long)pvVar2 + lVar16 * 4 + (long)(int)(uVar1 * 6) * 4;
        lVar29 = (long)pvVar2 + lVar16 * 4 + (long)(int)(uVar1 * 5) * 4;
        lVar52 = (long)pvVar2 + lVar16 * 4 + lVar35 * 4;
        lVar53 = (long)pvVar2 + lVar16 * 4 + lVar34 * 4;
        lVar49 = (long)pvVar2 + lVar16 * 4 + lVar39 * 4;
        lVar57 = (long)pvVar2 + lVar16 * 4 + lVar33 * 4;
        local_170 = (void *)((long)pvVar2 + lVar16 * 4);
        lVar20 = (long)iVar14;
        lVar16 = (long)pvVar2 + lVar20 * 4 + (long)(int)(uVar1 * 7) * 4;
        lVar11 = (long)pvVar2 + lVar20 * 4 + (long)(int)(uVar1 * 6) * 4;
        lVar27 = (long)pvVar2 + lVar20 * 4 + (long)(int)(uVar1 * 5) * 4;
        lVar21 = (long)pvVar2 + lVar20 * 4 + lVar35 * 4;
        local_110 = (long)pvVar2 + lVar20 * 4 + lVar34 * 4;
        local_108 = (long)pvVar2 + lVar20 * 4 + lVar39 * 4;
        lVar41 = (long)pvVar2 + lVar20 * 4 + lVar33 * 4;
        local_168 = (void *)((long)pvVar2 + lVar20 * 4);
        iVar18 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar20 = 0;
            do {
              *puVar32 = *(undefined4 *)((long)local_168 + lVar20);
              puVar32[1] = *(undefined4 *)(lVar41 + lVar20);
              puVar32[2] = *(undefined4 *)(local_108 + lVar20);
              puVar32[3] = *(undefined4 *)(local_110 + lVar20);
              puVar32[4] = *(undefined4 *)(lVar21 + lVar20);
              puVar32[5] = *(undefined4 *)(lVar27 + lVar20);
              puVar32[6] = *(undefined4 *)(lVar11 + lVar20);
              puVar32[7] = *(undefined4 *)(lVar16 + lVar20);
              puVar32[8] = *(undefined4 *)((long)local_170 + lVar20);
              puVar32[9] = *(undefined4 *)(lVar57 + lVar20);
              puVar32[10] = *(undefined4 *)(lVar49 + lVar20);
              puVar32[0xb] = *(undefined4 *)(lVar53 + lVar20);
              puVar32[0xc] = *(undefined4 *)(lVar52 + lVar20);
              puVar32[0xd] = *(undefined4 *)(lVar29 + lVar20);
              puVar32[0xe] = *(undefined4 *)(lVar61 + lVar20);
              puVar32[0xf] = *(undefined4 *)(lVar28 + lVar20);
              puVar32 = puVar32 + 0x10;
              lVar20 = lVar20 + 4;
            } while (uVar50 * 4 != lVar20);
          }
          local_168 = (void *)((long)local_168 + lVar31);
          local_170 = (void *)((long)local_170 + lVar31);
          iVar43 = iVar18 + 0xf;
          lVar28 = lVar28 + lVar31;
          lVar61 = lVar61 + lVar31;
          lVar29 = lVar29 + lVar31;
          lVar52 = lVar52 + lVar31;
          lVar53 = lVar53 + lVar31;
          lVar49 = lVar49 + lVar31;
          lVar57 = lVar57 + lVar31;
          lVar16 = lVar16 + lVar31;
          lVar11 = lVar11 + lVar31;
          lVar27 = lVar27 + lVar31;
          lVar21 = lVar21 + lVar31;
          local_110 = local_110 + lVar31;
          local_108 = local_108 + lVar31;
          lVar41 = lVar41 + lVar31;
          uVar17 = uVar37 & 0xfffffff8;
          iVar18 = iVar18 + 8;
        } while (iVar43 < (int)uVar37);
      }
      if ((int)(uVar17 | 3) < (int)uVar37) {
        pvVar8 = (void *)((long)local_170 + lVar34 * 4);
        pvVar48 = (void *)((long)local_170 + lVar40);
        pvVar42 = (void *)((long)local_170 + lVar30);
        pvVar23 = (void *)(lVar34 * 4 + (long)local_168);
        pvVar15 = (void *)((long)local_168 + lVar40);
        pvVar9 = (void *)((long)local_168 + lVar30);
        uVar13 = uVar17;
        do {
          if (0 < (int)uVar1) {
            lVar28 = 0;
            puVar54 = puVar32;
            do {
              puVar47 = puVar54;
              puVar54 = puVar32 + lVar28 * 2;
              *puVar54 = *(undefined4 *)((long)local_168 + lVar28);
              puVar54[1] = *(undefined4 *)((long)pvVar9 + lVar28);
              puVar54[2] = *(undefined4 *)((long)pvVar15 + lVar28);
              puVar54[3] = *(undefined4 *)((long)pvVar23 + lVar28);
              puVar54[4] = *(undefined4 *)((long)local_170 + lVar28);
              puVar54[5] = *(undefined4 *)((long)pvVar42 + lVar28);
              puVar54[6] = *(undefined4 *)((long)pvVar48 + lVar28);
              puVar54[7] = *(undefined4 *)((long)pvVar8 + lVar28);
              lVar28 = lVar28 + 4;
              puVar54 = puVar54 + 8;
            } while (uVar50 * 4 != lVar28);
            puVar32 = puVar47 + 8;
          }
          local_168 = (void *)((long)local_168 + lVar59);
          local_170 = (void *)((long)local_170 + lVar59);
          uVar17 = uVar13 + 4;
          iVar18 = uVar13 + 7;
          pvVar8 = (void *)((long)pvVar8 + lVar59);
          pvVar48 = (void *)((long)pvVar48 + lVar59);
          pvVar42 = (void *)((long)pvVar42 + lVar59);
          pvVar23 = (void *)((long)pvVar23 + lVar59);
          pvVar15 = (void *)((long)pvVar15 + lVar59);
          pvVar9 = (void *)((long)pvVar9 + lVar59);
          uVar13 = uVar17;
        } while (iVar18 < (int)uVar37);
      }
      uVar13 = uVar17 | 1;
      while ((int)uVar13 < (int)uVar37) {
        if (0 < (int)uVar1) {
          uVar45 = 0;
          pvVar8 = local_168;
          pvVar48 = local_170;
          do {
            puVar54 = puVar32;
            lVar61 = 0;
            lVar28 = 0;
            do {
              *(undefined4 *)((long)puVar54 + lVar28) = *(undefined4 *)((long)pvVar8 + lVar61);
              *(undefined4 *)((long)puVar54 + lVar28 + 4) = *(undefined4 *)((long)pvVar48 + lVar61);
              lVar28 = lVar28 + 8;
              lVar61 = lVar61 + lVar30;
            } while ((int)lVar28 == 8);
            uVar45 = uVar45 + 1;
            pvVar48 = (void *)((long)pvVar48 + 4);
            pvVar8 = (void *)((long)pvVar8 + 4);
            puVar32 = (undefined4 *)((long)puVar54 + lVar28);
          } while (uVar45 != uVar50);
          puVar32 = (undefined4 *)((long)puVar54 + lVar28);
        }
        local_168 = (void *)((long)local_168 + lVar40);
        local_170 = (void *)((long)local_170 + lVar40);
        uVar13 = uVar17 + 3;
        uVar17 = uVar17 + 2;
      }
      if ((int)uVar17 < (int)uVar37) {
        do {
          if (0 < (int)uVar1) {
            uVar45 = 0;
            do {
              *puVar32 = *(undefined4 *)((long)local_168 + uVar45 * 4);
              puVar32[1] = *(undefined4 *)((long)local_170 + uVar45 * 4);
              puVar32 = puVar32 + 2;
              uVar45 = uVar45 + 1;
            } while (uVar50 != uVar45);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar37);
      }
      uVar45 = uVar12 + 2;
      lVar28 = uVar12 + 3;
      uVar17 = (uint)lVar28;
      iVar19 = iVar19 + iVar55;
      iVar14 = iVar14 + iVar55;
      uVar12 = uVar45;
    } while (lVar28 < (long)uVar22);
  }
  iVar19 = (int)uVar45;
  if (iVar19 < (int)uVar24) {
    pvVar2 = (this->super_Convolution1D).weight_data.data;
    pvVar3 = (this->weight_data_tm).data;
    sVar4 = (this->weight_data_tm).elemsize;
    sVar5 = (this->weight_data_tm).cstep;
    local_158._0_4_ = uVar37 & 0xfffffff8;
    uVar45 = (ulong)iVar19;
    iVar19 = uVar1 * uVar37 * iVar19;
    do {
      uVar24 = (uint)uVar45;
      pvVar8 = (void *)((ulong)((uVar24 & 1) + ((uint)(uVar45 >> 3) & 0x1fffffff) +
                                ((uint)(uVar45 >> 2) & 1) + (uint)((uVar24 >> 1 & 1) != 0)) *
                        sVar4 * sVar5 + (long)pvVar3);
      if ((int)uVar37 < 8) {
        puVar32 = (undefined4 *)((long)pvVar2 + (long)(int)(uVar37 * uVar1 * uVar24) * 4);
        uVar24 = 0;
      }
      else {
        puVar32 = (undefined4 *)((long)pvVar2 + (long)iVar19 * 4);
        iVar55 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar12 = 0;
            puVar54 = puVar32;
            do {
              pvVar48 = pvVar8;
              lVar30 = 0;
              puVar47 = puVar54;
              do {
                *(undefined4 *)((long)pvVar48 + lVar30) = *puVar47;
                lVar30 = lVar30 + 4;
                puVar47 = puVar47 + lVar33;
              } while ((int)lVar30 != 0x20);
              uVar12 = uVar12 + 1;
              puVar54 = puVar54 + 1;
              pvVar8 = (void *)((long)pvVar48 + lVar30);
            } while (uVar12 != uVar50);
            pvVar8 = (void *)((long)pvVar48 + lVar30);
          }
          puVar32 = puVar32 + (int)(uVar1 * 8);
          iVar14 = iVar55 + 0xf;
          iVar55 = iVar55 + 8;
          uVar24 = (uint)local_158;
        } while (iVar14 < (int)uVar37);
      }
      uVar17 = uVar24 | 3;
      while ((int)uVar17 < (int)uVar37) {
        if (0 < (int)uVar1) {
          uVar12 = 0;
          puVar54 = puVar32;
          do {
            pvVar48 = pvVar8;
            lVar30 = 0;
            puVar47 = puVar54;
            do {
              *(undefined4 *)((long)pvVar48 + lVar30) = *puVar47;
              lVar30 = lVar30 + 4;
              puVar47 = puVar47 + lVar33;
            } while ((int)lVar30 != 0x10);
            uVar12 = uVar12 + 1;
            puVar54 = puVar54 + 1;
            pvVar8 = (void *)((long)pvVar48 + lVar30);
          } while (uVar12 != uVar50);
          pvVar8 = (void *)((long)pvVar48 + lVar30);
        }
        puVar32 = puVar32 + (int)(uVar1 * 4);
        uVar17 = uVar24 + 7;
        uVar24 = uVar24 + 4;
      }
      uVar17 = uVar24 | 1;
      while ((int)uVar17 < (int)uVar37) {
        if (0 < (int)uVar1) {
          uVar12 = 0;
          puVar54 = puVar32;
          do {
            pvVar48 = pvVar8;
            lVar30 = 0;
            puVar47 = puVar54;
            do {
              *(undefined4 *)((long)pvVar48 + lVar30) = *puVar47;
              lVar30 = lVar30 + 4;
              puVar47 = puVar47 + lVar33;
            } while ((int)lVar30 == 4);
            uVar12 = uVar12 + 1;
            puVar54 = puVar54 + 1;
            pvVar8 = (void *)((long)pvVar48 + lVar30);
          } while (uVar12 != uVar50);
          pvVar8 = (void *)((long)pvVar48 + lVar30);
        }
        puVar32 = puVar32 + (int)(uVar1 * 2);
        uVar17 = uVar24 + 3;
        uVar24 = uVar24 + 2;
      }
      if ((int)uVar24 < (int)uVar37) {
        do {
          if (0 < (int)uVar1) {
            lVar30 = 0;
            do {
              *(undefined4 *)((long)pvVar8 + lVar30) = *(undefined4 *)((long)puVar32 + lVar30);
              lVar30 = lVar30 + 4;
            } while (uVar50 * 4 - lVar30 != 0);
            pvVar8 = (void *)((long)pvVar8 + lVar30);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar37);
      }
      uVar45 = uVar45 + 1;
      iVar19 = iVar19 + uVar1 * uVar37;
    } while (uVar45 != uVar22);
  }
  if (opt->lightmode == true) {
    piVar6 = (this->super_Convolution1D).weight_data.refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pvVar2 = (this->super_Convolution1D).weight_data.data;
        pAVar7 = (this->super_Convolution1D).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar7->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution1D).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_Convolution1D).weight_data.elemsize + 4) = 0;
    (this->super_Convolution1D).weight_data.data = (void *)0x0;
    (this->super_Convolution1D).weight_data.refcount = (int *)0x0;
    (this->super_Convolution1D).weight_data.dims = 0;
    (this->super_Convolution1D).weight_data.w = 0;
    (this->super_Convolution1D).weight_data.h = 0;
    (this->super_Convolution1D).weight_data.d = 0;
    (this->super_Convolution1D).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}